

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetanimator.cpp
# Opt level: O0

void __thiscall
QWidgetAnimator::animate(QWidgetAnimator *this,QWidget *widget,QRect *_final_geometry,bool animate)

{
  bool bVar1;
  int iVar2;
  QStyle *pQVar3;
  ContextType *this_00;
  byte in_CL;
  undefined8 *in_RDX;
  QWidget *in_RSI;
  DeletionPolicy DVar4;
  long in_FS_OFFSET;
  QPropertyAnimation *anim;
  int animationDuration;
  const_iterator it;
  QRect final_geometry;
  QRect r;
  int in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  QWidget *in_stack_fffffffffffffe50;
  const_iterator *in_stack_fffffffffffffe58;
  ContextType *key;
  QSize *in_stack_fffffffffffffe60;
  QHash<QWidget_*,_QPointer<QPropertyAnimation>_> *this_01;
  QPoint *in_stack_fffffffffffffe68;
  QRect *in_stack_fffffffffffffe70;
  QVariant *this_02;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  QWidget *in_stack_fffffffffffffe88;
  QWidget *pQVar5;
  ContextType *slot;
  ContextType *context;
  undefined6 in_stack_fffffffffffffea0;
  byte bVar6;
  byte bVar7;
  ConnectionType type;
  Connection local_100;
  QRect *local_f8;
  undefined1 *puStack_f0;
  QHash<QWidget_*,_QPointer<QPropertyAnimation>_> local_e0;
  QByteArray local_d8;
  undefined1 local_c0 [16];
  QWidget *local_b0;
  QMainWindowLayout *in_stack_ffffffffffffff60;
  QRect *local_80;
  undefined1 *puStack_78;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = local_b0;
  QWidget::geometry(in_RSI);
  iVar2 = QRect::right((QRect *)0x49fafb);
  if ((iVar2 < 0) || (iVar2 = QRect::bottom((QRect *)0x49fb0d), iVar2 < 0)) {
    QRect::QRect((QRect *)in_stack_fffffffffffffe50);
  }
  if (((in_CL & 1) != 0) && (bVar1 = QRect::isNull((QRect *)in_stack_fffffffffffffe50), !bVar1)) {
    QRect::isNull((QRect *)in_stack_fffffffffffffe50);
  }
  local_80 = (QRect *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_78 = &DAT_aaaaaaaaaaaaaaaa;
  bVar1 = QRect::isValid((QRect *)in_stack_fffffffffffffe50);
  if ((bVar1) || (bVar1 = QWidget::isWindow(in_stack_fffffffffffffe50), bVar1)) {
    local_80 = (QRect *)*in_RDX;
    puStack_78 = (undefined1 *)in_RDX[1];
  }
  else {
    QWidget::width((QWidget *)0x49fbf9);
    QWidget::height((QWidget *)0x49fc13);
    QPoint::QPoint((QPoint *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,
                   in_stack_fffffffffffffe48);
    QWidget::size((QWidget *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    QRect::QRect(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  }
  type = (ConnectionType)in_RDX;
  pQVar3 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  iVar2 = (**(code **)(*(long *)pQVar3 + 0xf0))(pQVar3,0x71,0,in_RSI);
  if (iVar2 == 0) {
    QWidget::setGeometry
              (in_stack_fffffffffffffe88,
               (QRect *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    QMainWindowLayout::animationFinished(in_stack_ffffffffffffff60,pQVar5);
  }
  else {
    QHash<QWidget_*,_QPointer<QPropertyAnimation>_>::constFind
              ((QHash<QWidget_*,_QPointer<QPropertyAnimation>_> *)in_stack_fffffffffffffe50,
               (QWidget **)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    QHash<QWidget_*,_QPointer<QPropertyAnimation>_>::constEnd
              ((QHash<QWidget_*,_QPointer<QPropertyAnimation>_> *)in_stack_fffffffffffffe58);
    bVar1 = QHash<QWidget_*,_QPointer<QPropertyAnimation>_>::const_iterator::operator!=
                      (in_stack_fffffffffffffe58,(const_iterator *)in_stack_fffffffffffffe50);
    bVar6 = 0;
    bVar7 = bVar6;
    if (bVar1) {
      QHash<QWidget_*,_QPointer<QPropertyAnimation>_>::const_iterator::operator*
                ((const_iterator *)0x49fd3b);
      QPointer<QPropertyAnimation>::operator->((QPointer<QPropertyAnimation> *)0x49fd43);
      QVariantAnimation::endValue();
      local_c0 = ::QVariant::toRect();
      bVar6 = ::operator==((QRect *)in_stack_fffffffffffffe50,
                           (QRect *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      bVar7 = bVar6;
      ::QVariant::~QVariant(&local_28);
    }
    if ((bVar6 & 1) == 0) {
      this_00 = (ContextType *)operator_new(0x10);
      pQVar5 = in_RSI;
      QByteArray::QByteArray(&local_d8,"geometry",-1);
      QPropertyAnimation::QPropertyAnimation
                ((QPropertyAnimation *)this_00,&pQVar5->super_QObject,&local_d8,
                 &in_RSI->super_QObject);
      QByteArray::~QByteArray((QByteArray *)0x49fe24);
      DVar4 = (DeletionPolicy)this_00;
      slot = this_00;
      context = this_00;
      QVariantAnimation::setDuration(DVar4);
      this_01 = &local_e0;
      key = this_00;
      QEasingCurve::QEasingCurve((QEasingCurve *)this_01,InOutQuad);
      QVariantAnimation::setEasingCurve((QEasingCurve *)key);
      QEasingCurve::~QEasingCurve((QEasingCurve *)this_01);
      local_f8 = local_80;
      puStack_f0 = puStack_78;
      this_02 = &local_48;
      ::QVariant::QVariant(this_02,local_80);
      QVariantAnimation::setEndValue((QVariant *)this_00);
      ::QVariant::~QVariant(this_02);
      QHash<QWidget_*,_QPointer<QPropertyAnimation>_>::operator[](this_01,(QWidget **)key);
      QPointer<QPropertyAnimation>::operator=
                ((QPointer<QPropertyAnimation> *)in_stack_fffffffffffffe50,
                 (QPropertyAnimation *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48)
                );
      QObject::connect<void(QAbstractAnimation::*)(),void(QWidgetAnimator::*)()>
                ((Object *)CONCAT17(bVar7,CONCAT16(bVar6,in_stack_fffffffffffffea0)),0,context,
                 (offset_in_QWidgetAnimator_to_subr *)slot,type);
      QMetaObject::Connection::~Connection(&local_100);
      QAbstractAnimation::start(DVar4);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetAnimator::animate(QWidget *widget, const QRect &_final_geometry, bool animate)
{
    QRect r = widget->geometry();
    if (r.right() < 0 || r.bottom() < 0)
        r = QRect();

    animate = animate && !r.isNull() && !_final_geometry.isNull();

    // might make the widget go away by sending it to negative space
    const QRect final_geometry = _final_geometry.isValid() || widget->isWindow() ? _final_geometry :
        QRect(QPoint(-500 - widget->width(), -500 - widget->height()), widget->size());

#if QT_CONFIG(animation)
    //If the QStyle has animations, animate
    if (const int animationDuration = widget->style()->styleHint(QStyle::SH_Widget_Animation_Duration, nullptr, widget)) {
        AnimationMap::const_iterator it = m_animation_map.constFind(widget);
        if (it != m_animation_map.constEnd() && (*it)->endValue().toRect() == final_geometry)
            return;

        QPropertyAnimation *anim = new QPropertyAnimation(widget, "geometry", widget);
        anim->setDuration(animate ? animationDuration : 0);
        anim->setEasingCurve(QEasingCurve::InOutQuad);
        anim->setEndValue(final_geometry);
        m_animation_map[widget] = anim;
        connect(anim, &QPropertyAnimation::finished,
                this, &QWidgetAnimator::animationFinished);
        anim->start(QPropertyAnimation::DeleteWhenStopped);
    } else
#endif // animation
    {
    //we do it in one shot
    widget->setGeometry(final_geometry);
#if QT_CONFIG(mainwindow)
    m_mainWindowLayout->animationFinished(widget);
#endif // QT_CONFIG(mainwindow)
    }
}